

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  cmValue cVar7;
  long *plVar8;
  long *plVar9;
  char *__s;
  pointer pBVar10;
  undefined8 uVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  string extraLinkFlags;
  string linkLanguage;
  string exeFlags;
  string build;
  string configUpper;
  string local_178;
  undefined1 local_158 [32];
  pointer local_138;
  undefined8 local_130;
  size_type local_128;
  pointer local_120;
  undefined8 local_118;
  allocator<char> local_101;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_100;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  pointer local_b8;
  undefined8 local_b0;
  cmComputeLinkInformation *local_a0;
  string local_98;
  undefined1 local_78 [32];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  string local_50;
  
  local_100 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)linkFlags
  ;
  local_58 = linkLibs;
  cmsys::SystemTools::UpperCase((string *)local_78,config);
  local_a0 = cmGeneratorTarget::GetLinkInformation(target,config);
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(local_f8,linkLineComputer,target,config);
  TVar4 = cmGeneratorTarget::GetType(target);
  switch(TVar4) {
  case EXECUTABLE:
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (pointer)0x0;
    local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
    iVar5 = std::__cxx11::string::compare(local_f8);
    if (iVar5 == 0) {
LAB_00261ee7:
      AddLanguageFlagsForLinking(this,flags,target,(string *)local_f8,config);
      if (local_a0 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_a0,linkLineComputer,local_58,frameworkPath,linkPath);
      }
      pcVar2 = this->Makefile;
      pcVar1 = local_158 + 0x10;
      local_158._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"BUILD_SHARED_LIBS","");
      bVar3 = cmMakefile::IsOn(pcVar2,(string *)local_158);
      if ((pointer)local_158._0_8_ != pcVar1) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
      }
      if (bVar3) {
        std::operator+(&local_178,"CMAKE_SHARED_BUILD_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_158._16_8_ = *plVar9;
          local_158._24_8_ = plVar8[3];
          local_158._0_8_ = pcVar1;
        }
        else {
          local_158._16_8_ = *plVar9;
          local_158._0_8_ = (long *)*plVar8;
        }
        local_158._8_8_ = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_158);
        std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)(psVar6->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_d8._M_local_buf);
        if ((pointer)local_158._0_8_ != pcVar1) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
      }
      GetLinkLibsCMP0065(&local_178,this,(string *)local_f8,target);
      if (local_178._M_string_length != 0) {
        std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)local_178._M_dataplus._M_p);
        std::__cxx11::string::append(local_d8._M_local_buf);
      }
      local_158._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"LINK_FLAGS","");
      cVar7 = cmGeneratorTarget::GetProperty(target,(string *)local_158);
      if ((pointer)local_158._0_8_ != pcVar1) {
        operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
      }
      if (cVar7.Value != (string *)0x0) {
        std::__cxx11::string::_M_append
                  (local_d8._M_local_buf,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_d8._M_local_buf);
      }
      if (local_78._8_8_ != 0) {
        local_158._0_8_ = (pointer)0xb;
        local_158._8_8_ = "LINK_FLAGS_";
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = local_78._8_8_;
        local_138 = (pointer)local_78._0_8_;
        local_130 = 0;
        views_06._M_len = 2;
        views_06._M_array = (iterator)local_158;
        cmCatViews(&local_98,views_06);
        cVar7 = cmGeneratorTarget::GetProperty(target,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (cVar7.Value != (string *)0x0) {
          std::__cxx11::string::_M_append
                    (local_d8._M_local_buf,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_d8._M_local_buf);
        }
      }
      if ((pointer)local_d8._8_8_ != (pointer)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,&local_d8);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  (local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_158,target,config,(string *)local_f8);
      cmOutputConverter::SetLinkScriptShell
                (&this->super_cmOutputConverter,this->GlobalGenerator->UseLinkScript);
      AppendCompileOptions
                (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_100,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_158,(char *)0x0);
      cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      pBVar10 = (pointer)local_c8._0_8_;
      uVar11 = local_d8._M_allocated_capacity;
      if ((undefined1 *)local_d8._M_allocated_capacity == local_c8) break;
      goto LAB_00262285;
    }
    pcVar2 = this->Makefile;
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"CMAKE_EXE_LINKER_FLAGS","")
    ;
    cmMakefile::GetSafeDefinition(pcVar2,(string *)local_158);
    std::__cxx11::string::_M_assign((string *)local_d8._M_local_buf);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
    }
    std::__cxx11::string::append(local_d8._M_local_buf);
    if (local_78._8_8_ != 0) {
      pcVar2 = this->Makefile;
      local_158._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x17;
      local_158._8_8_ = "CMAKE_EXE_LINKER_FLAGS_";
      local_158._16_8_ = (pointer)0x0;
      local_158._24_8_ = local_78._8_8_;
      local_138 = (pointer)local_78._0_8_;
      local_130 = 0;
      views._M_len = 2;
      views._M_array = (iterator)local_158;
      cmCatViews(&local_178,views);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_178);
      std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)(psVar6->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append(local_d8._M_local_buf);
    }
    if (local_f8._8_8_ != 0) {
      bVar3 = cmGeneratorTarget::IsWin32Executable(target,config);
      pcVar2 = this->Makefile;
      if (bVar3) {
        local_158._0_8_ = (pointer)0x6;
        local_158._8_8_ = "CMAKE_";
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = local_f8._8_8_;
        local_138 = (pointer)local_f8._0_8_;
        local_130 = 0;
        local_128 = 0x11;
        local_120 = (pointer)0x819750;
        local_118 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_158;
        cmCatViews(&local_178,views_00);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_178);
        std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)(psVar6->_M_dataplus)._M_p);
      }
      else {
        local_158._0_8_ = (pointer)0x6;
        local_158._8_8_ = "CMAKE_";
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = local_f8._8_8_;
        local_138 = (pointer)local_f8._0_8_;
        local_130 = 0;
        local_128 = 0x13;
        local_120 = (pointer)0x819762;
        local_118 = 0;
        views_04._M_len = 3;
        views_04._M_array = (iterator)local_158;
        cmCatViews(&local_178,views_04);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_178);
        std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)(psVar6->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                 local_178.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append(local_d8._M_local_buf);
      bVar3 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar3) {
        pcVar2 = this->Makefile;
        local_158._0_8_ = (pointer)0x12;
        local_158._8_8_ = "CMAKE_EXE_EXPORTS_";
        local_158._16_8_ = (pointer)0x0;
        local_158._24_8_ = local_f8._8_8_;
        local_138 = (pointer)local_f8._0_8_;
        local_130 = 0;
        local_128 = 5;
        local_120 = (pointer)0x847542;
        local_118 = 0;
        views_05._M_len = 3;
        views_05._M_array = (iterator)local_158;
        cmCatViews(&local_178,views_05);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_178);
        std::__cxx11::string::_M_append(local_d8._M_local_buf,(ulong)(psVar6->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,
                          CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                   local_178.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append(local_d8._M_local_buf);
      }
      goto LAB_00261ee7;
    }
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "CMake can not determine linker language for target: ",psVar6);
    cmSystemTools::Error((string *)local_158);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
    }
    pBVar10 = (pointer)local_c8._0_8_;
    uVar11 = local_d8._M_allocated_capacity;
    if ((undefined1 *)local_d8._M_allocated_capacity == local_c8) goto LAB_00262366;
    goto LAB_0026235e;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_d8,this,config,(string *)local_f8,target);
    local_158._16_8_ = *(undefined8 *)(local_100 + 0x10);
    *(undefined8 *)(local_100 + 0x10) = local_c8._0_8_;
    local_158._0_8_ = *(undefined8 *)local_100;
    local_158._8_8_ = *(undefined8 *)(local_100 + 8);
    *(size_type *)local_100 = local_d8._M_allocated_capacity;
    *(undefined8 *)(local_100 + 8) = local_d8._8_8_;
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = (pointer)0x0;
    local_c8._0_8_ = (pointer)0x0;
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_d8);
    break;
  case SHARED_LIBRARY:
    __s = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_00261907;
  case MODULE_LIBRARY:
    __s = "CMAKE_MODULE_LINKER_FLAGS";
LAB_00261907:
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    iVar5 = std::__cxx11::string::compare(local_f8);
    if (iVar5 != 0) {
      pcVar2 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_101);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_50);
      local_d8._8_8_ = (psVar6->_M_dataplus)._M_p;
      local_d8._M_allocated_capacity = psVar6->_M_string_length;
      local_c8._0_8_ = (pointer)0x0;
      local_158._16_8_ = local_158 + 0x18;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x1;
      local_158[0x18] = 0x20;
      local_c8._8_8_ = 1;
      local_b0 = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_d8;
      local_b8 = (pointer)local_158._16_8_;
      cmCatViews(&local_98,views_01);
      std::__cxx11::string::operator=((string *)&local_178,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_78._8_8_ != 0) {
        local_158._0_8_ = &DAT_00000019;
        local_158._16_8_ = (pointer)0x0;
        local_138 = (pointer)(local_c8 + 8);
        local_d8._M_allocated_capacity = 0;
        local_d8._8_8_ = (pointer)0x1;
        local_c8[8] = 0x5f;
        local_158._24_8_ = 1;
        local_130 = 0;
        local_128 = local_78._8_8_;
        local_120 = (pointer)local_78._0_8_;
        local_118 = 0;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_158;
        local_158._8_8_ = __s;
        local_c8._0_8_ = local_138;
        cmCatViews(&local_98,views_02);
        psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,&local_98);
        std::__cxx11::string::_M_append((char *)&local_178,(ulong)(psVar6->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"LINK_FLAGS","");
    cVar7 = cmGeneratorTarget::GetProperty(target,(string *)local_158);
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
    }
    if (cVar7.Value != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)&local_178,(ulong)((cVar7.Value)->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_178);
    }
    if (local_78._8_8_ != 0) {
      local_158._0_8_ = (pointer)0xb;
      local_158._8_8_ = "LINK_FLAGS_";
      local_158._16_8_ = (pointer)0x0;
      local_158._24_8_ = local_78._8_8_;
      local_138 = (pointer)local_78._0_8_;
      local_130 = 0;
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_158;
      cmCatViews((string *)&local_d8,views_03);
      cVar7 = cmGeneratorTarget::GetProperty(target,(string *)&local_d8);
      if ((undefined1 *)local_d8._M_allocated_capacity != local_c8) {
        operator_delete((void *)local_d8._M_allocated_capacity,(ulong)(local_c8._0_8_ + 1));
      }
      if (cVar7.Value != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_178,(ulong)((cVar7.Value)->_M_dataplus)._M_p)
        ;
        std::__cxx11::string::append((char *)&local_178);
      }
    }
    if (local_178._M_string_length != 0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,&local_178);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>(local_100,&local_178);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_158,target,config,(string *)local_f8);
    cmOutputConverter::SetLinkScriptShell
              (&this->super_cmOutputConverter,this->GlobalGenerator->UseLinkScript);
    AppendCompileOptions
              (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_100,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_158,(char *)0x0);
    cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
    if (local_a0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_a0,linkLineComputer,local_58,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      pBVar10 = (pointer)CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                  local_178.field_2._M_local_buf[0]);
      uVar11 = local_178._M_dataplus._M_p;
LAB_00262285:
      operator_delete((void *)uVar11,(ulong)((long)&(pBVar10->Value)._M_dataplus._M_p + 1));
    }
  }
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  local_158._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_158 + 0x10);
  AppendLinkerTypeFlags(this,(string *)local_158,target,config,(string *)local_f8);
  AppendPositionIndependentLinkerFlags(this,(string *)local_158,target,config,(string *)local_f8);
  AppendIPOLinkerFlags(this,(string *)local_158,target,config,(string *)local_f8);
  AppendDependencyInfoLinkerFlags(this,(string *)local_158,target,config,(string *)local_f8);
  AppendModuleDefinitionFlag(this,(string *)local_158,target,linkLineComputer,config);
  if ((pointer)local_158._8_8_ != (pointer)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,local_158);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              (local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
  }
  pBVar10 = (pointer)local_158._16_8_;
  uVar11 = local_158._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_158 + 0x10)) {
LAB_0026235e:
    operator_delete((void *)uVar11,(ulong)((long)&(pBVar10->Value)._M_dataplus._M_p + 1));
  }
LAB_00262366:
  if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(sharedLibFlags);
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);

      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(exeFlags);
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendLinkerTypeFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendDependencyInfoLinkerFlags(extraLinkFlags, target, config,
                                        linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    this->GetGlobalGenerator()->EncodeLiteral(extraLinkFlags);
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}